

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::LoadInfo::Deserialize(LoadInfo *this,Deserializer *deserializer)

{
  LoadType LVar1;
  undefined1 uVar2;
  uint uVar3;
  pointer pLVar5;
  pointer *__ptr;
  string str;
  _Head_base<0UL,_duckdb::LoadInfo_*,_false> local_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  int iVar4;
  
  local_58._M_head_impl = (LoadInfo *)operator_new(0x80);
  ((local_58._M_head_impl)->super_ParseInfo).info_type = LOAD_INFO;
  ((local_58._M_head_impl)->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__LoadInfo_0246a058
  ;
  ((local_58._M_head_impl)->filename)._M_dataplus._M_p =
       (pointer)&((local_58._M_head_impl)->filename).field_2;
  ((local_58._M_head_impl)->filename)._M_string_length = 0;
  ((local_58._M_head_impl)->filename).field_2._M_local_buf[0] = '\0';
  ((local_58._M_head_impl)->repository)._M_dataplus._M_p =
       (pointer)&((local_58._M_head_impl)->repository).field_2;
  ((local_58._M_head_impl)->repository)._M_string_length = 0;
  ((local_58._M_head_impl)->repository).field_2._M_local_buf[0] = '\0';
  ((local_58._M_head_impl)->version)._M_dataplus._M_p =
       (pointer)&((local_58._M_head_impl)->version).field_2;
  ((local_58._M_head_impl)->version)._M_string_length = 0;
  ((local_58._M_head_impl)->version).field_2._M_local_buf[0] = '\0';
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"filename");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pLVar5->filename,(string *)&local_50);
    if (local_50 != local_40) goto LAB_0174e5c0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pLVar5->filename,(string *)&local_50);
    if (local_50 != local_40) {
LAB_0174e5c0:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"load_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    LVar1 = EnumUtil::FromString<duckdb::LoadType>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    LVar1 = (LoadType)iVar4;
  }
  pLVar5->load_type = LVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"repository");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pLVar5->repository,(string *)&local_50);
    if (local_50 != local_40) goto LAB_0174e6cd;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pLVar5->repository,(string *)&local_50);
    if (local_50 != local_40) {
LAB_0174e6cd:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"version");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pLVar5->version,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0174e76e;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pLVar5->version,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0174e76e;
  }
  operator_delete(local_50);
LAB_0174e76e:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"repo_is_alias");
  if ((char)uVar3 == '\0') {
    uVar2 = false;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar4;
  }
  pLVar5->repo_is_alias = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> LoadInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LoadInfo>(new LoadInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "filename", result->filename);
	deserializer.ReadProperty<LoadType>(201, "load_type", result->load_type);
	deserializer.ReadPropertyWithDefault<string>(202, "repository", result->repository);
	deserializer.ReadPropertyWithDefault<string>(203, "version", result->version);
	deserializer.ReadPropertyWithDefault<bool>(204, "repo_is_alias", result->repo_is_alias);
	return std::move(result);
}